

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O0

int SSL_set_max_proto_version(SSL *ssl,uint16_t version)

{
  SSL_PROTOCOL_METHOD *method;
  bool bVar1;
  pointer pSVar2;
  uint16_t version_local;
  SSL *ssl_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    method = ssl->method;
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    bVar1 = bssl::set_max_version(method,&pSVar2->conf_max_version,version);
    ssl_local._4_4_ = (uint)bVar1;
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set_max_proto_version(SSL *ssl, uint16_t version) {
  if (!ssl->config) {
    return 0;
  }
  return set_max_version(ssl->method, &ssl->config->conf_max_version, version);
}